

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculationengine.cpp
# Opt level: O0

ResultValue * __thiscall
CalculationEngine::evaluate
          (ResultValue *__return_storage_ptr__,CalculationEngine *this,string *expressionString,
          Environment *environment)

{
  bool bVar1;
  NumberType *numberType;
  pointer pEVar2;
  EvaluationStack *this_00;
  runtime_error *this_01;
  const_reference __src;
  EvaluationStack *evaluationStack;
  CalculationVisitor calculationVisitor;
  unique_ptr<Expression,_std::default_delete<Expression>_> expression;
  undefined1 local_130 [8];
  Parser parser;
  string local_58;
  undefined1 local_38 [8];
  vector<Token,_std::allocator<Token>_> tokens;
  Environment *environment_local;
  string *expressionString_local;
  CalculationEngine *this_local;
  
  tokens.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)environment;
  Environment::setEvalMode(environment,this->mEvalMode);
  std::__cxx11::string::string((string *)&local_58,(string *)expressionString);
  numberType = currentNumberType(this);
  Tokenizer::tokenize((vector<Token,_std::allocator<Token>_> *)local_38,&local_58,numberType);
  std::__cxx11::string::~string((string *)&local_58);
  Token::Token((Token *)&parser.mTokenIndex,END_OF_EXPRESSION);
  std::vector<Token,_std::allocator<Token>_>::push_back
            ((vector<Token,_std::allocator<Token>_> *)local_38,(value_type *)&parser.mTokenIndex);
  Token::~Token((Token *)&parser.mTokenIndex);
  std::vector<Token,_std::allocator<Token>_>::vector
            ((vector<Token,_std::allocator<Token>_> *)&expression,
             (vector<Token,_std::allocator<Token>_> *)local_38);
  Parser::Parser((Parser *)local_130,(vector<Token,_std::allocator<Token>_> *)&expression,this);
  std::vector<Token,_std::allocator<Token>_>::~vector
            ((vector<Token,_std::allocator<Token>_> *)&expression);
  Parser::parse((Parser *)&calculationVisitor.mEnvironment);
  CalculationVisitor::CalculationVisitor
            ((CalculationVisitor *)&evaluationStack,this,
             (Environment *)
             tokens.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  pEVar2 = std::unique_ptr<Expression,_std::default_delete<Expression>_>::operator->
                     ((unique_ptr<Expression,_std::default_delete<Expression>_> *)
                      &calculationVisitor.mEnvironment);
  (*pEVar2->_vptr_Expression[2])(pEVar2,&evaluationStack,0);
  this_00 = CalculationVisitor::evaluationStack((CalculationVisitor *)&evaluationStack);
  bVar1 = std::stack<ResultValue,_std::deque<ResultValue,_std::allocator<ResultValue>_>_>::empty
                    (this_00);
  if (!bVar1) {
    __src = std::stack<ResultValue,_std::deque<ResultValue,_std::allocator<ResultValue>_>_>::top
                      (this_00);
    memcpy(__return_storage_ptr__,__src,0x28);
    CalculationVisitor::~CalculationVisitor((CalculationVisitor *)&evaluationStack);
    std::unique_ptr<Expression,_std::default_delete<Expression>_>::~unique_ptr
              ((unique_ptr<Expression,_std::default_delete<Expression>_> *)
               &calculationVisitor.mEnvironment);
    Parser::~Parser((Parser *)local_130);
    std::vector<Token,_std::allocator<Token>_>::~vector
              ((vector<Token,_std::allocator<Token>_> *)local_38);
    return __return_storage_ptr__;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"Expected result.");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

ResultValue CalculationEngine::evaluate(const std::string& expressionString, Environment& environment) {
	environment.setEvalMode(mEvalMode);

	//Tokenize
	auto tokens = Tokenizer::tokenize(expressionString, currentNumberType());
	tokens.push_back(Token(TokenType::END_OF_EXPRESSION));

	//Parse
	Parser parser(tokens, *this);
	auto expression = parser.parse();

	//Evaluate
	CalculationVisitor calculationVisitor(*this, environment);
	expression->accept(calculationVisitor, nullptr);

	auto& evaluationStack = calculationVisitor.evaluationStack();
	if (evaluationStack.empty()) {
		throw std::runtime_error("Expected result.");
	}

	return evaluationStack.top();
}